

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_type.c
# Opt level: O3

void njd_set_accent_type(NJD *njd)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  NJDNode *pNVar9;
  NJDNode *pNVar10;
  NJDNode *node;
  int index;
  char rule [1024];
  int local_844;
  NJD *local_840;
  undefined4 local_838;
  char local_438 [1032];
  
  if ((njd != (NJD *)0x0) && (node = njd->head, node != (NJDNode *)0x0)) {
    iVar4 = 0;
    pNVar9 = (NJDNode *)0x0;
    local_840 = njd;
    do {
      pcVar5 = NJDNode_get_string(node);
      pNVar10 = pNVar9;
      if (pcVar5 != (char *)0x0) {
        pNVar10 = node;
        iVar8 = 0;
        if ((((node != njd->head) && (iVar2 = NJDNode_get_chain_flag(node), iVar8 = 0, iVar2 == 1))
            && (pNVar10 = pNVar9, iVar8 = iVar4, node->prev != (_NJDNode *)0x0)) &&
           (iVar2 = NJDNode_get_chain_flag(node), iVar2 == 1)) {
          pcVar5 = NJDNode_get_chain_rule(node);
          pcVar6 = NJDNode_get_pos(node->prev);
          local_844 = 0;
          if (pcVar5 != (char *)0x0) {
            do {
              bVar1 = get_token_from_string(pcVar5,&local_844,local_438);
              if (bVar1 < 0x2f) {
                if (bVar1 == 0x25) {
                  pcVar7 = strstr(pcVar6,local_438);
                  if (pcVar7 != (char *)0x0) {
                    bVar1 = get_token_from_string(pcVar5,&local_844,(char *)&local_838);
                    goto LAB_00171a69;
                  }
                }
                else if (bVar1 == 0) goto LAB_00171a40;
              }
              else if ((bVar1 == 0x2f) || (bVar1 == 0x40)) {
LAB_00171a40:
                strcpy((char *)&local_838,local_438);
LAB_00171a69:
                iVar2 = 0;
                if (bVar1 == 0x40) {
                  get_token_from_string(pcVar5,&local_844,local_438);
                  iVar2 = atoi(local_438);
                }
                njd = local_840;
                if (((short)local_838 == 0x2a) ||
                   (local_838._2_1_ == '\0' && (short)local_838 == 0x3146)) goto LAB_00171c64;
                if (local_838._2_1_ == '\0' && (short)local_838 == 0x3246) {
                  iVar3 = NJDNode_get_acc(pNVar9);
                  if (iVar3 != 0) goto LAB_00171c64;
LAB_00171c1e:
                  iVar2 = iVar2 + iVar4;
                }
                else {
                  if (local_838._2_1_ == '\0' && (short)local_838 == 0x3346) {
                    iVar3 = NJDNode_get_acc(pNVar9);
                    if (iVar3 != 0) goto LAB_00171c1e;
                    goto LAB_00171c64;
                  }
                  if (local_838._2_1_ == '\0' && (short)local_838 == 0x3446) goto LAB_00171c1e;
                  if (local_838._2_1_ == '\0' && (short)local_838 == 0x3546) goto LAB_00171c54;
                  if (local_838._2_1_ == '\0' && (short)local_838 == 0x3143) {
LAB_00171c43:
                    iVar2 = NJDNode_get_acc(node);
                    iVar2 = iVar2 + iVar4;
                  }
                  else if (local_838._2_1_ == '\0' && (short)local_838 == 0x3243) {
                    iVar2 = iVar4 + 1;
                  }
                  else {
                    iVar2 = iVar4;
                    if (local_838._2_1_ != '\0' || (short)local_838 != 0x3343) {
                      if (local_838._2_1_ != '\0' || (short)local_838 != 0x3443) {
                        if (local_838._2_1_ == '\0' && (short)local_838 == 0x3543)
                        goto LAB_00171c64;
                        if (local_838._2_1_ != '\0' || (short)local_838 != 0x3150) {
                          if (local_838._2_1_ == '\0' && (short)local_838 == 0x3250) {
                            iVar2 = NJDNode_get_acc(node);
                            if (iVar2 != 0) goto LAB_00172236;
                            iVar2 = iVar4 + 1;
                          }
                          else {
                            if (local_838._2_1_ == '\0' && (short)local_838 == 0x3650)
                            goto LAB_00171c54;
                            if ((local_838 != 0x343150) ||
                               (iVar2 = NJDNode_get_acc(node), njd = local_840, iVar2 == 0))
                            goto LAB_00171c64;
LAB_00172236:
                            iVar2 = NJDNode_get_acc(node);
                            iVar2 = iVar2 + iVar4;
                          }
                          NJDNode_set_acc(pNVar9,iVar2);
                          njd = local_840;
                          goto LAB_00171c64;
                        }
                        iVar2 = NJDNode_get_acc(node);
                        if (iVar2 != 0) goto LAB_00171c43;
                      }
LAB_00171c54:
                      iVar2 = 0;
                    }
                  }
                }
                NJDNode_set_acc(pNVar9,iVar2);
                goto LAB_00171c64;
              }
              while ((bVar1 == 0x25 || (bVar1 == 0x40))) {
                bVar1 = get_token_from_string(pcVar5,&local_844,local_438);
              }
            } while (bVar1 != 0);
          }
          local_838 = CONCAT22(local_838._2_2_,0x2a);
          njd = local_840;
        }
LAB_00171c64:
        if ((node->prev != (_NJDNode *)0x0) && (iVar4 = NJDNode_get_chain_flag(node), iVar4 == 1)) {
          pcVar5 = NJDNode_get_pos_group1(node->prev);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_134907 + 9);
          if (iVar4 == 0) {
            pcVar5 = NJDNode_get_pos_group1(node);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_134907 + 9);
            if (iVar4 == 0) {
              pcVar5 = NJDNode_get_string(node);
              iVar4 = strcmp(pcVar5,anon_var_dwarf_132dfb);
              if (iVar4 == 0) {
                pcVar5 = NJDNode_get_string(node->prev);
                if (pcVar5 != (char *)0x0) {
                  pcVar5 = NJDNode_get_string(node->prev);
                  iVar4 = strcmp(pcVar5,anon_var_dwarf_132ede);
                  if (iVar4 != 0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_132e06);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->prev);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_132f74);
                      if (iVar4 != 0) {
                        pcVar5 = NJDNode_get_string(node->prev);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_134781);
                        if (iVar4 != 0) {
                          NJDNode_get_string(node->prev);
                        }
                      }
                    }
                  }
                }
                NJDNode_set_acc(node->prev,1);
                pcVar5 = NJDNode_get_string(node->prev);
                if (pcVar5 != (char *)0x0) {
                  pcVar5 = NJDNode_get_string(node->prev);
                  iVar4 = strcmp(pcVar5,anon_var_dwarf_132d48);
                  if (iVar4 != 0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_132d5e);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->prev);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_132f56);
                      if (iVar4 != 0) goto LAB_001721b7;
                    }
                  }
                  if ((node->next != (NJDNode *)0x0) &&
                     (pcVar5 = NJDNode_get_string(node->next), pcVar5 != (char *)0x0)) {
                    pcVar5 = NJDNode_get_string(node->next);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_132dce);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->next);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_132d32);
                      if (iVar4 != 0) {
                        pcVar5 = NJDNode_get_string(node->next);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_132ede);
                        if (iVar4 != 0) {
                          pcVar5 = NJDNode_get_string(node->next);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_132e06);
                          if (iVar4 != 0) {
                            pcVar5 = NJDNode_get_string(node->next);
                            iVar4 = strcmp(pcVar5,anon_var_dwarf_132d48);
                            if (iVar4 != 0) {
                              pcVar5 = NJDNode_get_string(node->next);
                              iVar4 = strcmp(pcVar5,anon_var_dwarf_132d5e);
                              if (iVar4 != 0) {
                                pcVar5 = NJDNode_get_string(node->next);
                                iVar4 = strcmp(pcVar5,anon_var_dwarf_132f38);
                                if (iVar4 != 0) {
                                  pcVar5 = NJDNode_get_string(node->next);
                                  iVar4 = strcmp(pcVar5,anon_var_dwarf_132f56);
                                  if (iVar4 != 0) {
                                    pcVar5 = NJDNode_get_string(node->next);
                                    iVar4 = strcmp(pcVar5,anon_var_dwarf_132f74);
                                    if (iVar4 != 0) goto LAB_001721b7;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    pNVar9 = node->prev;
                    iVar4 = 0;
                    goto LAB_001721b2;
                  }
                }
              }
              else {
                pcVar5 = NJDNode_get_string(node);
                iVar4 = strcmp(pcVar5,anon_var_dwarf_13340b);
                if (iVar4 == 0) {
                  pcVar5 = NJDNode_get_string(node->prev);
                  if (pcVar5 != (char *)0x0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_132f38);
                    if (iVar4 == 0) goto LAB_001721a9;
                  }
                  pcVar5 = NJDNode_get_string(node->prev);
                  if (pcVar5 != (char *)0x0) {
                    pcVar5 = NJDNode_get_string(node->prev);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_132ede);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node->prev);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_132e06);
                      if (iVar4 != 0) {
                        pcVar5 = NJDNode_get_string(node->prev);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_132f74);
                        if (iVar4 != 0) {
                          pcVar5 = NJDNode_get_string(node->prev);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_134781);
                          if (iVar4 != 0) goto LAB_001720d5;
                        }
                      }
                    }
                    goto LAB_0017219e;
                  }
LAB_001720d5:
                  pNVar9 = node->prev;
                  iVar4 = NJDNode_get_mora_size(pNVar9);
                  iVar2 = NJDNode_get_mora_size(node);
                  iVar4 = iVar4 + iVar2;
                }
                else {
                  pcVar5 = NJDNode_get_string(node);
                  iVar4 = strcmp(pcVar5,anon_var_dwarf_134769);
                  if (iVar4 != 0) {
                    pcVar5 = NJDNode_get_string(node);
                    iVar4 = strcmp(pcVar5,anon_var_dwarf_134775);
                    if (iVar4 != 0) {
                      pcVar5 = NJDNode_get_string(node);
                      iVar4 = strcmp(pcVar5,anon_var_dwarf_134861);
                      if (iVar4 == 0) {
                        pcVar5 = NJDNode_get_string(node->prev);
                        if (pcVar5 != (char *)0x0) {
                          pcVar5 = NJDNode_get_string(node->prev);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_132dce);
                          if (iVar4 != 0) {
                            pcVar5 = NJDNode_get_string(node->prev);
                            iVar4 = strcmp(pcVar5,anon_var_dwarf_132d5e);
                            if (iVar4 != 0) {
                              pcVar5 = NJDNode_get_string(node->prev);
                              iVar4 = strcmp(pcVar5,anon_var_dwarf_132f38);
                              if (iVar4 != 0) {
                                pcVar5 = NJDNode_get_string(node->prev);
                                iVar4 = strcmp(pcVar5,anon_var_dwarf_132f56);
                                if (iVar4 != 0) {
                                  pcVar5 = NJDNode_get_string(node->prev);
                                  pcVar6 = anon_var_dwarf_13483e;
                                  goto LAB_00172195;
                                }
                              }
                            }
                          }
                          goto LAB_001721a9;
                        }
                      }
                      else {
                        pcVar5 = NJDNode_get_string(node);
                        iVar4 = strcmp(pcVar5,anon_var_dwarf_13486c);
                        if (iVar4 != 0) goto LAB_001721b7;
                        pcVar5 = NJDNode_get_string(node->prev);
                        if (pcVar5 != (char *)0x0) {
                          pcVar5 = NJDNode_get_string(node->prev);
                          iVar4 = strcmp(pcVar5,anon_var_dwarf_132d5e);
                          if (iVar4 != 0) {
                            pcVar5 = NJDNode_get_string(node->prev);
                            pcVar6 = anon_var_dwarf_132f38;
LAB_00172195:
                            iVar4 = strcmp(pcVar5,pcVar6);
                            if (iVar4 != 0) goto LAB_0017219e;
                          }
LAB_001721a9:
                          pNVar9 = node->prev;
                          iVar4 = 2;
                          goto LAB_001721b2;
                        }
                      }
LAB_0017219e:
                      pNVar9 = node->prev;
                      iVar4 = 1;
                      goto LAB_001721b2;
                    }
                  }
                  pNVar9 = node->prev;
                  iVar4 = NJDNode_get_mora_size(pNVar9);
                  iVar4 = iVar4 + 1;
                }
LAB_001721b2:
                NJDNode_set_acc(pNVar9,iVar4);
              }
            }
          }
        }
LAB_001721b7:
        pcVar5 = NJDNode_get_string(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_132dfb);
        if (((iVar4 == 0) && (iVar4 = NJDNode_get_chain_flag(node), iVar4 != 1)) &&
           (node->next != (NJDNode *)0x0)) {
          pcVar5 = NJDNode_get_pos_group1(node->next);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_134907 + 9);
          if (iVar4 == 0) {
            NJDNode_set_acc(node,0);
          }
        }
        iVar4 = NJDNode_get_mora_size(node);
        iVar4 = iVar4 + iVar8;
      }
      node = node->next;
      pNVar9 = pNVar10;
    } while (node != (_NJDNode *)0x0);
  }
  return;
}

Assistant:

void njd_set_accent_type(NJD * njd)
{
   NJDNode *node;
   NJDNode *top_node = NULL;
   char rule[MAXBUFLEN];
   int add_type = 0;
   int mora_size = 0;

   if (njd == NULL || njd->head == NULL)
      return;

   for (node = njd->head; node != NULL; node = node->next) {
      if (NJDNode_get_string(node) == NULL)
         continue;
      if ((node == njd->head) || (NJDNode_get_chain_flag(node) != 1)) {
         /* store the top node */
         top_node = node;
         mora_size = 0;
      } else if (node->prev != NULL && NJDNode_get_chain_flag(node) == 1) {
         /* get accent change type */
         get_rule(NJDNode_get_chain_rule(node), NJDNode_get_pos(node->prev), rule, &add_type);

         /* change accent type */
         if (strcmp(rule, "*") == 0) {  /* no chnage */
         } else if (strcmp(rule, "F1") == 0) {  /* for ancillary word */
         } else if (strcmp(rule, "F2") == 0) {
            if (NJDNode_get_acc(top_node) == 0)
               NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F3") == 0) {
            if (NJDNode_get_acc(top_node) != 0)
               NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F4") == 0) {
            NJDNode_set_acc(top_node, mora_size + add_type);
         } else if (strcmp(rule, "F5") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "C1") == 0) {  /* for noun */
            NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "C2") == 0) {
            NJDNode_set_acc(top_node, mora_size + 1);
         } else if (strcmp(rule, "C3") == 0) {
            NJDNode_set_acc(top_node, mora_size);
         } else if (strcmp(rule, "C4") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "C5") == 0) {
         } else if (strcmp(rule, "P1") == 0) {  /* for postfix */
            if (NJDNode_get_acc(node) == 0)
               NJDNode_set_acc(top_node, 0);
            else
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "P2") == 0) {
            if (NJDNode_get_acc(node) == 0)
               NJDNode_set_acc(top_node, mora_size + 1);
            else
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         } else if (strcmp(rule, "P6") == 0) {
            NJDNode_set_acc(top_node, 0);
         } else if (strcmp(rule, "P14") == 0) {
            if (NJDNode_get_acc(node) != 0)
               NJDNode_set_acc(top_node, mora_size + NJDNode_get_acc(node));
         }
      }

      /* change accent type for digit */
      if (node->prev != NULL && NJDNode_get_chain_flag(node) == 1 &&
          strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_TYPE_KAZU) == 0 &&
          strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_TYPE_KAZU) == 0) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_JYUU) == 0) { /* 10^1 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SAN) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_YON) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_KYUU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NAN) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SUU) == 0)) {
               NJDNode_set_acc(node->prev, 1);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_GO) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_HACHI) == 0)) {
               if (node->next != NULL && NJDNode_get_string(node->next) != NULL
                   && (strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_ICHI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_NI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_SAN) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_YON) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_GO) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_ROKU) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_NANA) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_HACHI) == 0
                       || strcmp(NJDNode_get_string(node->next), NJD_SET_ACCENT_TYPE_KYUU) == 0))
                  NJDNode_set_acc(node->prev, 0);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_HYAKU) == 0) { /* 10^2 */
            if (NJDNode_get_string(node->prev) != NULL
                && strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0) {
               NJDNode_set_acc(node->prev, 2);
            } else if (NJDNode_get_string(node->prev) != NULL &&
                       (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_SAN) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_YON) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_KYUU) == 0 ||
                        strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NAN) == 0)) {
               NJDNode_set_acc(node->prev, 1);
            } else {
               NJDNode_set_acc(node->prev,
                               NJDNode_get_mora_size(node->prev) + NJDNode_get_mora_size(node));
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_SEN) == 0) {   /* 10^3 */
            NJDNode_set_acc(node->prev, NJDNode_get_mora_size(node->prev) + 1);
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_MAN) == 0) {   /* 10^4 */
            NJDNode_set_acc(node->prev, NJDNode_get_mora_size(node->prev) + 1);
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_OKU) == 0) {   /* 10^8 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ICHI) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_HACHI) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_IKU) == 0)) {
               NJDNode_set_acc(node->prev, 2);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
         } else if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_CHOU) == 0) {  /* 10^12 */
            if (NJDNode_get_string(node->prev) != NULL &&
                (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_ROKU) == 0 ||
                 strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_TYPE_NANA) == 0)) {
               NJDNode_set_acc(node->prev, 2);
            } else {
               NJDNode_set_acc(node->prev, 1);
            }
         }
      }

      if (strcmp(NJDNode_get_string(node), NJD_SET_ACCENT_TYPE_JYUU) == 0 &&
          NJDNode_get_chain_flag(node) != 1 && node->next != NULL &&
          strcmp(NJDNode_get_pos_group1(node->next), NJD_SET_ACCENT_TYPE_KAZU) == 0) {
         NJDNode_set_acc(node, 0);
      }

      mora_size += NJDNode_get_mora_size(node);
   }
}